

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O1

int Extra_ThreshSelectWeights5(word *t,int nVars,int *pW)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int Cost;
  int iVar4;
  uint uVar5;
  int Cost_1;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int i;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  bool bVar13;
  
  uVar7 = 1;
  uVar8 = 1 << ((byte)nVars & 0x1f);
  if (nVars != 5) {
    __assert_fail("nVars == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddThresh.c"
                  ,0xd8,"int Extra_ThreshSelectWeights5(word *, int, int *)");
  }
  pW[4] = 1;
  do {
    pW[3] = uVar7;
    uVar5 = uVar7;
    do {
      pW[2] = uVar5;
      uVar1 = uVar5;
      do {
        pW[1] = uVar1;
        uVar2 = uVar1;
        do {
          *pW = uVar2;
          uVar3 = uVar2;
          do {
            iVar4 = 10000;
            uVar11 = 0;
            bVar13 = true;
            iVar6 = 0;
            do {
              uVar10 = (uint)uVar11;
              lVar9 = 0;
              if ((t[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0) {
                iVar12 = 0;
                do {
                  if ((uVar10 >> ((uint)lVar9 & 0x1f) & 1) != 0) {
                    iVar12 = iVar12 + pW[lVar9];
                  }
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 5);
                if (iVar6 <= iVar12) {
                  iVar6 = iVar12;
                }
              }
              else {
                iVar12 = 0;
                do {
                  if ((uVar10 >> ((uint)lVar9 & 0x1f) & 1) != 0) {
                    iVar12 = iVar12 + pW[lVar9];
                  }
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 5);
                if (iVar12 <= iVar4) {
                  iVar4 = iVar12;
                }
              }
              if (iVar4 <= iVar6) break;
              uVar10 = uVar10 + 1;
              uVar11 = (ulong)uVar10;
              bVar13 = (int)uVar10 < (int)uVar8;
            } while (uVar10 != uVar8);
            if (!bVar13) {
              if (iVar6 < iVar4) {
                return iVar4;
              }
              __assert_fail("Lmax < Lmin",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddThresh.c"
                            ,0xec,"int Extra_ThreshSelectWeights5(word *, int, int *)");
            }
            *pW = uVar3 + 1;
            bVar13 = uVar3 < 5;
            uVar3 = uVar3 + 1;
          } while (bVar13);
          pW[1] = uVar2 + 1;
          bVar13 = uVar2 < 5;
          uVar2 = uVar2 + 1;
        } while (bVar13);
        pW[2] = uVar1 + 1;
        bVar13 = uVar1 < 5;
        uVar1 = uVar1 + 1;
      } while (bVar13);
      uVar5 = uVar5 + 1;
      pW[3] = uVar5;
    } while (uVar5 != 6);
    uVar7 = uVar7 + 1;
    pW[4] = uVar7;
    if (uVar7 == 6) {
      return 0;
    }
  } while( true );
}

Assistant:

int Extra_ThreshSelectWeights5(word * t, int nVars, int * pW) {
    int m, Lmin, Lmax, nMints = (1 << nVars), Limit = nVars + 0;
    assert(nVars == 5);
    for (pW[4] = 1; pW[4] <= Limit; pW[4]++)
        for (pW[3] = pW[4]; pW[3] <= Limit; pW[3]++)
            for (pW[2] = pW[3]; pW[2] <= Limit; pW[2]++)
                for (pW[1] = pW[2]; pW[1] <= Limit; pW[1]++)
                    for (pW[0] = pW[1]; pW[0] <= Limit; pW[0]++) {
                        Lmin = 10000;
                        Lmax = 0;
                        for (m = 0; m < nMints; m++) {
                            if (Abc_TtGetBit(t, m))
                                Lmin = Abc_MinInt(Lmin,
                                        Extra_ThreshWeightedSum(pW, nVars, m));
                            else
                                Lmax = Abc_MaxInt(Lmax,
                                        Extra_ThreshWeightedSum(pW, nVars, m));
                            if (Lmax >= Lmin)
                                break;
                        }
                        if (m < nMints)
                            continue;
                        assert(Lmax < Lmin);
                        return Lmin;
                    }
    return 0;
}